

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

String * MakeFormatArgument<String>(String *__return_storage_ptr__,List<String> *list)

{
  bool bVar1;
  reference a;
  String local_e8;
  ConstIterator local_c8;
  ConstIterator local_a8;
  undefined1 local_88 [8];
  ConstIterator it;
  undefined1 local_38 [8];
  String result;
  List<String> *list_local;
  
  result._24_8_ = list;
  String::String((String *)local_38);
  bVar1 = List<String>::isEmpty((List<String> *)result._24_8_);
  if (bVar1) {
    String::String(__return_storage_ptr__,"{}");
  }
  else {
    String::String((String *)&it._M_node,"{ ");
    String::operator=((String *)local_38,(String *)&it._M_node);
    String::~String((String *)&it._M_node);
    List<String>::begin((ConstIterator *)local_88,(List<String> *)result._24_8_);
    while( true ) {
      List<String>::end(&local_a8,(List<String> *)result._24_8_);
      bVar1 = std::operator!=((_Self *)local_88,&local_a8);
      if (!bVar1) break;
      List<String>::begin(&local_c8,(List<String> *)result._24_8_);
      bVar1 = std::operator!=((_Self *)local_88,&local_c8);
      if (bVar1) {
        String::operator+=((String *)local_38,", ");
      }
      a = std::_Deque_iterator<String,_const_String_&,_const_String_*>::operator*
                    ((_Deque_iterator<String,_const_String_&,_const_String_*> *)local_88);
      MakeFormatArgument(&local_e8,a);
      String::operator+=((String *)local_38,&local_e8);
      String::~String(&local_e8);
      std::_Deque_iterator<String,_const_String_&,_const_String_*>::operator++
                ((_Deque_iterator<String,_const_String_&,_const_String_*> *)local_88);
    }
    String::operator+=((String *)local_38," }");
    String::String(__return_storage_ptr__,(String *)local_38);
  }
  String::~String((String *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline String MakeFormatArgument (List<T> const& list)
{
	String result;

	if (list.isEmpty())
		return "{}";

	result = "{ ";

	for (auto it = list.begin(); it != list.end(); ++it)
	{
		if (it != list.begin())
			result += ", ";

		result += MakeFormatArgument (*it);
	}

	result += " }";
	return result;
}